

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

ColorEncodingHandle pbrt::ColorEncodingHandle::Get(string *name)

{
  bool bVar1;
  int iVar2;
  char *file;
  size_type sVar3;
  char *__nptr;
  iterator this;
  iterator __k;
  mapped_type *this_00;
  LogLevel extraout_var;
  string *in_RSI;
  GammaColorEncoding *in_RDI;
  float fVar4;
  double dVar5;
  string_view in_stack_00000000;
  iterator iter;
  Float gamma;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  ColorEncodingHandle *enc;
  GammaColorEncoding *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff8c;
  Float gamma_00;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding> args;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  iterator args_00;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  LogLevel level;
  pointer in_stack_ffffffffffffffe0;
  
  args.bits = (uintptr_t)in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (bVar1) {
    ColorEncodingHandle((ColorEncodingHandle *)in_stack_ffffffffffffff70,
                        (ColorEncodingHandle *)in_stack_ffffffffffffff68);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      if ((Get(std::__cxx11::string_const&)::cache == '\0') &&
         (iVar2 = __cxa_guard_acquire(&Get(std::__cxx11::string_const&)::cache), iVar2 != 0)) {
        std::
        map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
        ::map((map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
               *)0x52b3ba);
        __cxa_atexit(std::
                     map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                     ::~map,&Get::cache,&__dso_handle);
        __cxa_guard_release(&Get(std::__cxx11::string_const&)::cache);
      }
      file = (char *)std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
      level = extraout_var;
      SplitStringsFromWhitespace_abi_cxx11_(in_stack_00000000);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd8);
      if (sVar3 == 2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffd8,0);
        bVar1 = std::operator!=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        gamma_00 = (Float)CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffd8,1);
          __nptr = (char *)std::__cxx11::string::c_str();
          dVar5 = atof(__nptr);
          fVar4 = (float)dVar5;
          if ((fVar4 == 0.0) && (!NAN(fVar4))) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffffd8,1);
            ErrorExit<std::__cxx11::string&>
                      ((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       args.bits);
          }
          this = std::
                 map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                 ::find((map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                         *)in_stack_ffffffffffffff68,(key_type *)0x52b4e1);
          args_00 = this;
          __k = std::
                map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                ::end((map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                       *)in_stack_ffffffffffffff68);
          bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb0,
                                  (_Self *)&stack0xffffffffffffffa8);
          if (bVar1) {
            std::_Rb_tree_iterator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_float,_pbrt::ColorEncodingHandle>_> *)
                       0x52b522);
            ColorEncodingHandle((ColorEncodingHandle *)in_stack_ffffffffffffff70,
                                (ColorEncodingHandle *)in_stack_ffffffffffffff68);
          }
          else {
            operator_new(0x1404);
            GammaColorEncoding::GammaColorEncoding(in_RDI,gamma_00);
            TaggedPointer<pbrt::GammaColorEncoding>
                      ((ColorEncodingHandle *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            this_00 = std::
                      map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                      ::operator[]((map<float,_pbrt::ColorEncodingHandle,_std::less<float>,_std::allocator<std::pair<const_float,_pbrt::ColorEncodingHandle>_>_>
                                    *)args_00._M_node,(key_type *)__k._M_node);
            operator=(this_00,(ColorEncodingHandle *)in_stack_ffffffffffffff68);
            if (LOGGING_LogLevel < 1) {
              Log<std::__cxx11::string_const&,float&,pbrt::ColorEncodingHandle&>
                        (level,file,in_stack_ffffffffffffffc4,
                         (char *)CONCAT44(in_stack_ffffffffffffffbc,fVar4),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         args_00._M_node,(float *)__k._M_node,
                         (ColorEncodingHandle *)in_stack_ffffffffffffffe0);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this._M_node);
          return (ColorEncodingHandle)
                 (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                  )args.bits;
        }
      }
      ErrorExit<std::__cxx11::string_const&>
                ((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
    }
    ColorEncodingHandle((ColorEncodingHandle *)in_stack_ffffffffffffff70,
                        (ColorEncodingHandle *)in_stack_ffffffffffffff68);
  }
  return (ColorEncodingHandle)
         (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )args.bits;
}

Assistant:

const ColorEncodingHandle ColorEncodingHandle::Get(const std::string &name) {
    if (name == "linear")
        return Linear;
    else if (name == "sRGB")
        return sRGB;
    else {
        static std::map<float, ColorEncodingHandle> cache;

        std::vector<std::string> params = SplitStringsFromWhitespace(name);
        if (params.size() != 2 || params[0] != "gamma")
            ErrorExit("%s: expected \"gamma <value>\" for color encoding", name);
        Float gamma = atof(params[1].c_str());
        if (gamma == 0)
            ErrorExit("%s: unable to parse gamma value", params[1]);

        auto iter = cache.find(gamma);
        if (iter != cache.end())
            return iter->second;

        ColorEncodingHandle enc = new GammaColorEncoding(gamma);
        cache[gamma] = enc;
        LOG_VERBOSE("Added ColorEncoding %s for gamma %f -> %s", name, gamma, enc);
        return enc;
    }
}